

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

bool Rml::Assert(char *msg,char *file,int line)

{
  int iVar1;
  SystemInterface *pSVar2;
  SystemInterface *system_interface;
  undefined1 local_40 [7];
  bool result;
  String message;
  int line_local;
  char *file_local;
  char *msg_local;
  
  message.field_2._12_4_ = line;
  CreateString_abi_cxx11_((String *)local_40,"%s\n%s:%d",msg,file,(ulong)(uint)line);
  pSVar2 = GetSystemInterface();
  if (pSVar2 == (SystemInterface *)0x0) {
    system_interface._7_1_ = LogDefault::LogMessage(LT_ASSERT,(String *)local_40);
  }
  else {
    iVar1 = (*pSVar2->_vptr_SystemInterface[5])(pSVar2,2,local_40);
    system_interface._7_1_ = (bool)((byte)iVar1 & 1);
  }
  ::std::__cxx11::string::~string((string *)local_40);
  return system_interface._7_1_;
}

Assistant:

bool Assert(const char* msg, const char* file, int line)
{
	String message = CreateString("%s\n%s:%d", msg, file, line);

	bool result = true;
	if (SystemInterface* system_interface = GetSystemInterface())
		result = system_interface->LogMessage(Log::LT_ASSERT, message);
	else
		result = LogDefault::LogMessage(Log::LT_ASSERT, message);

	return result;
}